

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O3

void luaD_poscall(lua_State *L,CallInfo *ci,int nres)

{
  l_uint32 *plVar1;
  CallInfo *ci_00;
  StkId pSVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  lu_byte lVar31;
  uint uVar32;
  uint uVar33;
  StkId level;
  undefined1 *puVar34;
  long lVar35;
  ulong uVar36;
  long lVar37;
  TValue *io1;
  undefined1 auVar38 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  int iVar58;
  int iVar61;
  int iVar62;
  undefined1 auVar59 [16];
  int iVar63;
  undefined1 auVar60 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  int iVar77;
  int iVar81;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  
  uVar33 = ci->callstatus;
  if ((L->hookmask != 0) && ((uVar33 >> 0x12 & 1) == 0)) {
    rethook(L,ci,nres);
  }
  level = (ci->func).p;
  uVar32 = uVar33 & 0x400ff;
  if (uVar32 == 0) {
    lVar37 = (long)nres;
    if (0 < nres) {
      pSVar2 = (L->top).p;
      lVar35 = 0;
      do {
        *(undefined8 *)((long)level + lVar35) =
             *(undefined8 *)((long)pSVar2 + lVar35 + lVar37 * -0x10);
        *(undefined1 *)((long)level + lVar35 + 8) =
             *(undefined1 *)((long)pSVar2 + lVar35 + lVar37 * -0x10 + 8);
        lVar35 = lVar35 + 0x10;
      } while ((ulong)(uint)nres << 4 != lVar35);
    }
  }
  else {
    if (uVar32 == 2) {
      if (nres == 0) {
        lVar31 = '\0';
      }
      else {
        pSVar2 = (L->top).p;
        (level->val).value_ = pSVar2[-(long)nres].val.value_;
        lVar31 = *(lu_byte *)((long)pSVar2 + (long)nres * -0x10 + 8);
      }
      (level->val).tt_ = lVar31;
      level = level + 1;
      goto LAB_0010c26c;
    }
    if (uVar32 == 1) goto LAB_0010c26c;
    uVar32 = (uVar33 & 0xff) - 1;
    if ((uVar33 >> 0x12 & 1) != 0) {
      (L->ci->u2).funcidx = nres;
      plVar1 = &L->ci->callstatus;
      *plVar1 = *plVar1 | 0x20000;
      level = luaF_close(L,level,'\x06',1);
      ci_00 = L->ci;
      plVar1 = &ci_00->callstatus;
      *plVar1 = *plVar1 & 0xfffdffff;
      if (L->hookmask != 0) {
        lVar37 = (L->stack).offset;
        rethook(L,ci_00,nres);
        level = (StkId)(((long)level - lVar37) + (long)(L->stack).p);
      }
      if ((uVar33 & 0xff) == 0) {
        uVar32 = nres;
      }
    }
    uVar36 = (ulong)uVar32;
    if (nres < (int)uVar32) {
      uVar36 = (ulong)(uint)nres;
    }
    uVar33 = (uint)uVar36;
    if ((int)uVar33 < 1) {
      uVar33 = 0;
    }
    else {
      pSVar2 = (L->top).p;
      lVar37 = 0;
      do {
        *(undefined8 *)((long)level + lVar37) =
             *(undefined8 *)((long)pSVar2 + lVar37 + (long)nres * -0x10);
        *(undefined1 *)((long)level + lVar37 + 8) =
             *(undefined1 *)((long)pSVar2 + lVar37 + (long)nres * -0x10 + 8);
        lVar37 = lVar37 + 0x10;
      } while (uVar36 << 4 != lVar37);
    }
    auVar30 = _DAT_0012cad0;
    auVar29 = _DAT_0012cac0;
    auVar28 = _DAT_0012cab0;
    auVar27 = _DAT_0012caa0;
    auVar26 = _DAT_0012ca90;
    auVar25 = _DAT_0012ca80;
    auVar24 = _DAT_0012ca70;
    if ((int)uVar33 < (int)uVar32) {
      lVar37 = (ulong)uVar32 - (ulong)uVar33;
      lVar35 = lVar37 + -1;
      auVar38._8_4_ = (int)lVar35;
      auVar38._0_8_ = lVar35;
      auVar38._12_4_ = (int)((ulong)lVar35 >> 0x20);
      puVar34 = (undefined1 *)((long)level + (ulong)uVar33 * 0x10 + 0xf8);
      uVar36 = 0;
      do {
        auVar56._8_4_ = (int)uVar36;
        auVar56._0_8_ = uVar36;
        auVar56._12_4_ = (int)(uVar36 >> 0x20);
        auVar59 = auVar38 ^ auVar30;
        auVar64 = (auVar56 | auVar29) ^ auVar30;
        iVar58 = auVar59._0_4_;
        iVar77 = -(uint)(iVar58 < auVar64._0_4_);
        iVar61 = auVar59._4_4_;
        auVar66._4_4_ = -(uint)(iVar61 < auVar64._4_4_);
        iVar62 = auVar59._8_4_;
        iVar81 = -(uint)(iVar62 < auVar64._8_4_);
        iVar63 = auVar59._12_4_;
        auVar66._12_4_ = -(uint)(iVar63 < auVar64._12_4_);
        auVar39._4_4_ = iVar77;
        auVar39._0_4_ = iVar77;
        auVar39._8_4_ = iVar81;
        auVar39._12_4_ = iVar81;
        auVar39 = pshuflw(in_XMM1,auVar39,0xe8);
        auVar65._4_4_ = -(uint)(auVar64._4_4_ == iVar61);
        auVar65._12_4_ = -(uint)(auVar64._12_4_ == iVar63);
        auVar65._0_4_ = auVar65._4_4_;
        auVar65._8_4_ = auVar65._12_4_;
        auVar48 = pshuflw(in_XMM2,auVar65,0xe8);
        auVar66._0_4_ = auVar66._4_4_;
        auVar66._8_4_ = auVar66._12_4_;
        auVar64 = pshuflw(auVar39,auVar66,0xe8);
        auVar59._8_4_ = 0xffffffff;
        auVar59._0_8_ = 0xffffffffffffffff;
        auVar59._12_4_ = 0xffffffff;
        auVar59 = (auVar64 | auVar48 & auVar39) ^ auVar59;
        auVar59 = packssdw(auVar59,auVar59);
        if ((auVar59 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          puVar34[-0xf0] = 0;
        }
        auVar48._4_4_ = iVar77;
        auVar48._0_4_ = iVar77;
        auVar48._8_4_ = iVar81;
        auVar48._12_4_ = iVar81;
        auVar66 = auVar65 & auVar48 | auVar66;
        auVar59 = packssdw(auVar66,auVar66);
        auVar64._8_4_ = 0xffffffff;
        auVar64._0_8_ = 0xffffffffffffffff;
        auVar64._12_4_ = 0xffffffff;
        auVar59 = packssdw(auVar59 ^ auVar64,auVar59 ^ auVar64);
        auVar59 = packsswb(auVar59,auVar59);
        if ((auVar59._0_4_ >> 8 & 1) != 0) {
          puVar34[-0xe0] = 0;
        }
        auVar59 = (auVar56 | auVar28) ^ auVar30;
        auVar49._0_4_ = -(uint)(iVar58 < auVar59._0_4_);
        auVar49._4_4_ = -(uint)(iVar61 < auVar59._4_4_);
        auVar49._8_4_ = -(uint)(iVar62 < auVar59._8_4_);
        auVar49._12_4_ = -(uint)(iVar63 < auVar59._12_4_);
        auVar67._4_4_ = auVar49._0_4_;
        auVar67._0_4_ = auVar49._0_4_;
        auVar67._8_4_ = auVar49._8_4_;
        auVar67._12_4_ = auVar49._8_4_;
        iVar77 = -(uint)(auVar59._4_4_ == iVar61);
        iVar81 = -(uint)(auVar59._12_4_ == iVar63);
        auVar12._4_4_ = iVar77;
        auVar12._0_4_ = iVar77;
        auVar12._8_4_ = iVar81;
        auVar12._12_4_ = iVar81;
        auVar78._4_4_ = auVar49._4_4_;
        auVar78._0_4_ = auVar49._4_4_;
        auVar78._8_4_ = auVar49._12_4_;
        auVar78._12_4_ = auVar49._12_4_;
        auVar59 = auVar12 & auVar67 | auVar78;
        auVar59 = packssdw(auVar59,auVar59);
        auVar3._8_4_ = 0xffffffff;
        auVar3._0_8_ = 0xffffffffffffffff;
        auVar3._12_4_ = 0xffffffff;
        auVar59 = packssdw(auVar59 ^ auVar3,auVar59 ^ auVar3);
        auVar59 = packsswb(auVar59,auVar59);
        if ((auVar59._0_4_ >> 0x10 & 1) != 0) {
          puVar34[-0xd0] = 0;
        }
        auVar59 = pshufhw(auVar59,auVar67,0x84);
        auVar13._4_4_ = iVar77;
        auVar13._0_4_ = iVar77;
        auVar13._8_4_ = iVar81;
        auVar13._12_4_ = iVar81;
        auVar64 = pshufhw(auVar49,auVar13,0x84);
        auVar39 = pshufhw(auVar59,auVar78,0x84);
        auVar40._8_4_ = 0xffffffff;
        auVar40._0_8_ = 0xffffffffffffffff;
        auVar40._12_4_ = 0xffffffff;
        auVar40 = (auVar39 | auVar64 & auVar59) ^ auVar40;
        auVar59 = packssdw(auVar40,auVar40);
        auVar59 = packsswb(auVar59,auVar59);
        if ((auVar59._0_4_ >> 0x18 & 1) != 0) {
          puVar34[-0xc0] = 0;
        }
        auVar59 = (auVar56 | auVar27) ^ auVar30;
        auVar50._0_4_ = -(uint)(iVar58 < auVar59._0_4_);
        auVar50._4_4_ = -(uint)(iVar61 < auVar59._4_4_);
        auVar50._8_4_ = -(uint)(iVar62 < auVar59._8_4_);
        auVar50._12_4_ = -(uint)(iVar63 < auVar59._12_4_);
        auVar14._4_4_ = auVar50._0_4_;
        auVar14._0_4_ = auVar50._0_4_;
        auVar14._8_4_ = auVar50._8_4_;
        auVar14._12_4_ = auVar50._8_4_;
        auVar64 = pshuflw(auVar78,auVar14,0xe8);
        auVar41._0_4_ = -(uint)(auVar59._0_4_ == iVar58);
        auVar41._4_4_ = -(uint)(auVar59._4_4_ == iVar61);
        auVar41._8_4_ = -(uint)(auVar59._8_4_ == iVar62);
        auVar41._12_4_ = -(uint)(auVar59._12_4_ == iVar63);
        auVar68._4_4_ = auVar41._4_4_;
        auVar68._0_4_ = auVar41._4_4_;
        auVar68._8_4_ = auVar41._12_4_;
        auVar68._12_4_ = auVar41._12_4_;
        auVar59 = pshuflw(auVar41,auVar68,0xe8);
        auVar69._4_4_ = auVar50._4_4_;
        auVar69._0_4_ = auVar50._4_4_;
        auVar69._8_4_ = auVar50._12_4_;
        auVar69._12_4_ = auVar50._12_4_;
        auVar39 = pshuflw(auVar50,auVar69,0xe8);
        auVar4._8_4_ = 0xffffffff;
        auVar4._0_8_ = 0xffffffffffffffff;
        auVar4._12_4_ = 0xffffffff;
        auVar59 = packssdw(auVar59 & auVar64,(auVar39 | auVar59 & auVar64) ^ auVar4);
        auVar59 = packsswb(auVar59,auVar59);
        if ((auVar59 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          puVar34[-0xb0] = 0;
        }
        auVar15._4_4_ = auVar50._0_4_;
        auVar15._0_4_ = auVar50._0_4_;
        auVar15._8_4_ = auVar50._8_4_;
        auVar15._12_4_ = auVar50._8_4_;
        auVar69 = auVar68 & auVar15 | auVar69;
        auVar39 = packssdw(auVar69,auVar69);
        auVar5._8_4_ = 0xffffffff;
        auVar5._0_8_ = 0xffffffffffffffff;
        auVar5._12_4_ = 0xffffffff;
        auVar59 = packssdw(auVar59,auVar39 ^ auVar5);
        auVar59 = packsswb(auVar59,auVar59);
        if ((auVar59._4_2_ >> 8 & 1) != 0) {
          puVar34[-0xa0] = 0;
        }
        auVar59 = (auVar56 | auVar26) ^ auVar30;
        auVar51._0_4_ = -(uint)(iVar58 < auVar59._0_4_);
        auVar51._4_4_ = -(uint)(iVar61 < auVar59._4_4_);
        auVar51._8_4_ = -(uint)(iVar62 < auVar59._8_4_);
        auVar51._12_4_ = -(uint)(iVar63 < auVar59._12_4_);
        auVar70._4_4_ = auVar51._0_4_;
        auVar70._0_4_ = auVar51._0_4_;
        auVar70._8_4_ = auVar51._8_4_;
        auVar70._12_4_ = auVar51._8_4_;
        iVar77 = -(uint)(auVar59._4_4_ == iVar61);
        iVar81 = -(uint)(auVar59._12_4_ == iVar63);
        auVar16._4_4_ = iVar77;
        auVar16._0_4_ = iVar77;
        auVar16._8_4_ = iVar81;
        auVar16._12_4_ = iVar81;
        auVar79._4_4_ = auVar51._4_4_;
        auVar79._0_4_ = auVar51._4_4_;
        auVar79._8_4_ = auVar51._12_4_;
        auVar79._12_4_ = auVar51._12_4_;
        auVar59 = auVar16 & auVar70 | auVar79;
        auVar59 = packssdw(auVar59,auVar59);
        auVar6._8_4_ = 0xffffffff;
        auVar6._0_8_ = 0xffffffffffffffff;
        auVar6._12_4_ = 0xffffffff;
        auVar59 = packssdw(auVar59 ^ auVar6,auVar59 ^ auVar6);
        auVar59 = packsswb(auVar59,auVar59);
        if ((auVar59 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          puVar34[-0x90] = 0;
        }
        auVar59 = pshufhw(auVar59,auVar70,0x84);
        auVar17._4_4_ = iVar77;
        auVar17._0_4_ = iVar77;
        auVar17._8_4_ = iVar81;
        auVar17._12_4_ = iVar81;
        auVar64 = pshufhw(auVar51,auVar17,0x84);
        auVar39 = pshufhw(auVar59,auVar79,0x84);
        auVar42._8_4_ = 0xffffffff;
        auVar42._0_8_ = 0xffffffffffffffff;
        auVar42._12_4_ = 0xffffffff;
        auVar42 = (auVar39 | auVar64 & auVar59) ^ auVar42;
        auVar59 = packssdw(auVar42,auVar42);
        auVar59 = packsswb(auVar59,auVar59);
        if ((auVar59._6_2_ >> 8 & 1) != 0) {
          puVar34[-0x80] = 0;
        }
        auVar59 = (auVar56 | auVar25) ^ auVar30;
        auVar52._0_4_ = -(uint)(iVar58 < auVar59._0_4_);
        auVar52._4_4_ = -(uint)(iVar61 < auVar59._4_4_);
        auVar52._8_4_ = -(uint)(iVar62 < auVar59._8_4_);
        auVar52._12_4_ = -(uint)(iVar63 < auVar59._12_4_);
        auVar18._4_4_ = auVar52._0_4_;
        auVar18._0_4_ = auVar52._0_4_;
        auVar18._8_4_ = auVar52._8_4_;
        auVar18._12_4_ = auVar52._8_4_;
        auVar64 = pshuflw(auVar79,auVar18,0xe8);
        auVar43._0_4_ = -(uint)(auVar59._0_4_ == iVar58);
        auVar43._4_4_ = -(uint)(auVar59._4_4_ == iVar61);
        auVar43._8_4_ = -(uint)(auVar59._8_4_ == iVar62);
        auVar43._12_4_ = -(uint)(auVar59._12_4_ == iVar63);
        auVar71._4_4_ = auVar43._4_4_;
        auVar71._0_4_ = auVar43._4_4_;
        auVar71._8_4_ = auVar43._12_4_;
        auVar71._12_4_ = auVar43._12_4_;
        auVar59 = pshuflw(auVar43,auVar71,0xe8);
        auVar72._4_4_ = auVar52._4_4_;
        auVar72._0_4_ = auVar52._4_4_;
        auVar72._8_4_ = auVar52._12_4_;
        auVar72._12_4_ = auVar52._12_4_;
        auVar39 = pshuflw(auVar52,auVar72,0xe8);
        auVar53._8_4_ = 0xffffffff;
        auVar53._0_8_ = 0xffffffffffffffff;
        auVar53._12_4_ = 0xffffffff;
        auVar53 = (auVar39 | auVar59 & auVar64) ^ auVar53;
        auVar39 = packssdw(auVar53,auVar53);
        auVar59 = packsswb(auVar59 & auVar64,auVar39);
        if ((auVar59 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          puVar34[-0x70] = 0;
        }
        auVar19._4_4_ = auVar52._0_4_;
        auVar19._0_4_ = auVar52._0_4_;
        auVar19._8_4_ = auVar52._8_4_;
        auVar19._12_4_ = auVar52._8_4_;
        auVar72 = auVar71 & auVar19 | auVar72;
        auVar39 = packssdw(auVar72,auVar72);
        auVar7._8_4_ = 0xffffffff;
        auVar7._0_8_ = 0xffffffffffffffff;
        auVar7._12_4_ = 0xffffffff;
        auVar39 = packssdw(auVar39 ^ auVar7,auVar39 ^ auVar7);
        auVar59 = packsswb(auVar59,auVar39);
        if ((auVar59._8_2_ >> 8 & 1) != 0) {
          puVar34[-0x60] = 0;
        }
        auVar59 = (auVar56 | auVar24) ^ auVar30;
        auVar54._0_4_ = -(uint)(iVar58 < auVar59._0_4_);
        auVar54._4_4_ = -(uint)(iVar61 < auVar59._4_4_);
        auVar54._8_4_ = -(uint)(iVar62 < auVar59._8_4_);
        auVar54._12_4_ = -(uint)(iVar63 < auVar59._12_4_);
        auVar73._4_4_ = auVar54._0_4_;
        auVar73._0_4_ = auVar54._0_4_;
        auVar73._8_4_ = auVar54._8_4_;
        auVar73._12_4_ = auVar54._8_4_;
        iVar77 = -(uint)(auVar59._4_4_ == iVar61);
        iVar81 = -(uint)(auVar59._12_4_ == iVar63);
        auVar20._4_4_ = iVar77;
        auVar20._0_4_ = iVar77;
        auVar20._8_4_ = iVar81;
        auVar20._12_4_ = iVar81;
        auVar80._4_4_ = auVar54._4_4_;
        auVar80._0_4_ = auVar54._4_4_;
        auVar80._8_4_ = auVar54._12_4_;
        auVar80._12_4_ = auVar54._12_4_;
        auVar59 = auVar20 & auVar73 | auVar80;
        auVar59 = packssdw(auVar59,auVar59);
        auVar8._8_4_ = 0xffffffff;
        auVar8._0_8_ = 0xffffffffffffffff;
        auVar8._12_4_ = 0xffffffff;
        auVar59 = packssdw(auVar59 ^ auVar8,auVar59 ^ auVar8);
        auVar59 = packsswb(auVar59,auVar59);
        if ((auVar59 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          puVar34[-0x50] = 0;
        }
        auVar59 = pshufhw(auVar59,auVar73,0x84);
        auVar21._4_4_ = iVar77;
        auVar21._0_4_ = iVar77;
        auVar21._8_4_ = iVar81;
        auVar21._12_4_ = iVar81;
        auVar64 = pshufhw(auVar54,auVar21,0x84);
        auVar39 = pshufhw(auVar59,auVar80,0x84);
        auVar44._8_4_ = 0xffffffff;
        auVar44._0_8_ = 0xffffffffffffffff;
        auVar44._12_4_ = 0xffffffff;
        auVar44 = (auVar39 | auVar64 & auVar59) ^ auVar44;
        auVar59 = packssdw(auVar44,auVar44);
        auVar59 = packsswb(auVar59,auVar59);
        if ((auVar59._10_2_ >> 8 & 1) != 0) {
          puVar34[-0x40] = 0;
        }
        auVar59 = (auVar56 | _DAT_0012ca60) ^ auVar30;
        auVar55._0_4_ = -(uint)(iVar58 < auVar59._0_4_);
        auVar55._4_4_ = -(uint)(iVar61 < auVar59._4_4_);
        auVar55._8_4_ = -(uint)(iVar62 < auVar59._8_4_);
        auVar55._12_4_ = -(uint)(iVar63 < auVar59._12_4_);
        auVar22._4_4_ = auVar55._0_4_;
        auVar22._0_4_ = auVar55._0_4_;
        auVar22._8_4_ = auVar55._8_4_;
        auVar22._12_4_ = auVar55._8_4_;
        auVar64 = pshuflw(auVar80,auVar22,0xe8);
        auVar45._0_4_ = -(uint)(auVar59._0_4_ == iVar58);
        auVar45._4_4_ = -(uint)(auVar59._4_4_ == iVar61);
        auVar45._8_4_ = -(uint)(auVar59._8_4_ == iVar62);
        auVar45._12_4_ = -(uint)(auVar59._12_4_ == iVar63);
        auVar74._4_4_ = auVar45._4_4_;
        auVar74._0_4_ = auVar45._4_4_;
        auVar74._8_4_ = auVar45._12_4_;
        auVar74._12_4_ = auVar45._12_4_;
        auVar59 = pshuflw(auVar45,auVar74,0xe8);
        auVar75._4_4_ = auVar55._4_4_;
        auVar75._0_4_ = auVar55._4_4_;
        auVar75._8_4_ = auVar55._12_4_;
        auVar75._12_4_ = auVar55._12_4_;
        auVar39 = pshuflw(auVar55,auVar75,0xe8);
        auVar9._8_4_ = 0xffffffff;
        auVar9._0_8_ = 0xffffffffffffffff;
        auVar9._12_4_ = 0xffffffff;
        auVar59 = packssdw(auVar59 & auVar64,(auVar39 | auVar59 & auVar64) ^ auVar9);
        auVar59 = packsswb(auVar59,auVar59);
        if ((auVar59 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          puVar34[-0x30] = 0;
        }
        auVar23._4_4_ = auVar55._0_4_;
        auVar23._0_4_ = auVar55._0_4_;
        auVar23._8_4_ = auVar55._8_4_;
        auVar23._12_4_ = auVar55._8_4_;
        auVar75 = auVar74 & auVar23 | auVar75;
        auVar39 = packssdw(auVar75,auVar75);
        auVar10._8_4_ = 0xffffffff;
        auVar10._0_8_ = 0xffffffffffffffff;
        auVar10._12_4_ = 0xffffffff;
        auVar59 = packssdw(auVar59,auVar39 ^ auVar10);
        auVar59 = packsswb(auVar59,auVar59);
        if ((auVar59._12_2_ >> 8 & 1) != 0) {
          puVar34[-0x20] = 0;
        }
        auVar59 = (auVar56 | _DAT_0012ca50) ^ auVar30;
        auVar46._0_4_ = -(uint)(iVar58 < auVar59._0_4_);
        auVar46._4_4_ = -(uint)(iVar61 < auVar59._4_4_);
        auVar46._8_4_ = -(uint)(iVar62 < auVar59._8_4_);
        auVar46._12_4_ = -(uint)(iVar63 < auVar59._12_4_);
        auVar76._4_4_ = auVar46._0_4_;
        auVar76._0_4_ = auVar46._0_4_;
        auVar76._8_4_ = auVar46._8_4_;
        auVar76._12_4_ = auVar46._8_4_;
        auVar57._4_4_ = -(uint)(auVar59._4_4_ == iVar61);
        auVar57._12_4_ = -(uint)(auVar59._12_4_ == iVar63);
        auVar57._0_4_ = auVar57._4_4_;
        auVar57._8_4_ = auVar57._12_4_;
        auVar60._4_4_ = auVar46._4_4_;
        auVar60._0_4_ = auVar46._4_4_;
        auVar60._8_4_ = auVar46._12_4_;
        auVar60._12_4_ = auVar46._12_4_;
        auVar39 = auVar57 & auVar76 | auVar60;
        auVar59 = packssdw(auVar46,auVar39);
        auVar11._8_4_ = 0xffffffff;
        auVar11._0_8_ = 0xffffffffffffffff;
        auVar11._12_4_ = 0xffffffff;
        auVar59 = packssdw(auVar59 ^ auVar11,auVar59 ^ auVar11);
        auVar59 = packsswb(auVar59,auVar59);
        if ((auVar59 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          puVar34[-0x10] = 0;
        }
        auVar59 = pshufhw(auVar59,auVar76,0x84);
        auVar39 = pshufhw(auVar39,auVar57,0x84);
        in_XMM2 = auVar39 & auVar59;
        auVar59 = pshufhw(auVar59,auVar60,0x84);
        auVar47._8_4_ = 0xffffffff;
        auVar47._0_8_ = 0xffffffffffffffff;
        auVar47._12_4_ = 0xffffffff;
        auVar47 = (auVar59 | in_XMM2) ^ auVar47;
        auVar59 = packssdw(auVar47,auVar47);
        in_XMM1 = packsswb(auVar59,auVar59);
        if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
          *puVar34 = 0;
        }
        uVar36 = uVar36 + 0x10;
        puVar34 = puVar34 + 0x100;
      } while ((lVar37 + 0xfU & 0xfffffffffffffff0) != uVar36);
    }
    lVar37 = (long)(int)uVar32;
  }
  level = level + lVar37;
LAB_0010c26c:
  (L->top).p = level;
  L->ci = ci->previous;
  return;
}

Assistant:

void luaD_poscall (lua_State *L, CallInfo *ci, int nres) {
  l_uint32 fwanted = ci->callstatus & (CIST_TBC | CIST_NRESULTS);
  if (l_unlikely(L->hookmask) && !(fwanted & CIST_TBC))
    rethook(L, ci, nres);
  /* move results to proper place */
  moveresults(L, ci->func.p, nres, fwanted);
  /* function cannot be in any of these cases when returning */
  lua_assert(!(ci->callstatus &
        (CIST_HOOKED | CIST_YPCALL | CIST_FIN | CIST_CLSRET)));
  L->ci = ci->previous;  /* back to caller (after closing variables) */
}